

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printAssignName(JSPrinter *this,Ref node)

{
  AssignName *pAVar1;
  
  pAVar1 = cashew::Value::asAssignName(node.inst);
  emit(this,(pAVar1->target_).str._M_str);
  space(this);
  emit(this,'=');
  space(this);
  printChild(this,(pAVar1->super_Value).field_1.ref.inst,node,1);
  return;
}

Assistant:

void printAssignName(Ref node) {
    auto* assign = node->asAssignName();
    emit(assign->target().str.data());
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }